

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O0

void __thiscall
TEST_SimpleStringBuffer_setWriteLimit_TestShell::~TEST_SimpleStringBuffer_setWriteLimit_TestShell
          (TEST_SimpleStringBuffer_setWriteLimit_TestShell *this)

{
  TEST_SimpleStringBuffer_setWriteLimit_TestShell *this_local;
  
  ~TEST_SimpleStringBuffer_setWriteLimit_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(SimpleStringBuffer, setWriteLimit)
{
    SimpleStringBuffer buffer;
    buffer.setWriteLimit(10);
    for (int i = 0; i < SimpleStringBuffer::SIMPLE_STRING_BUFFER_LEN ; i++)
        buffer.add("h");
    SimpleString str("h", 10);
    STRCMP_EQUAL(str.asCharString(), buffer.toString());
}